

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O3

bool __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::TryGetFixedProperty<false,true>
          (DictionaryTypeHandlerBase<unsigned_short> *this,PropertyRecord *propertyRecord,
          Var *pProperty,FixedPropertyKind propertyType,ScriptContext *requestContext)

{
  RecyclerWeakReference<Js::DynamicObject> *pRVar1;
  DynamicObject *this_00;
  code *pcVar2;
  bool bVar3;
  unsigned_short uVar4;
  RecyclableObject *obj;
  undefined4 *puVar5;
  int local_4c;
  undefined4 *puStack_48;
  int i;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord_local;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  
  pRVar1 = (this->singletonInstance).ptr;
  if (((pRVar1 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
      (this_00 = (DynamicObject *)(pRVar1->super_RecyclerWeakReferenceBase).strongRef,
      this_00 != (DynamicObject *)0x0)) &&
     ((((((this_00->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
      super_JavascriptLibraryBase).scriptContext.ptr == requestContext)) {
    local_40 = propertyRecord;
    bVar3 = JsUtil::
            BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::TryGetReference<Js::PropertyRecord_const*>
                      ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)(this->propertyMap).ptr,&local_40,
                       (DictionaryPropertyDescriptor<unsigned_short> **)&propertyRecord_local,
                       &local_4c);
    if (bVar3) {
      if (((((ulong)(propertyRecord_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject & 0x800) == 0) &&
          (((ulong)(propertyRecord_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject & 0x20) != 0)) &&
         (uVar4 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>
                            ((DictionaryPropertyDescriptor<unsigned_short> *)propertyRecord_local),
         uVar4 != 0xffff)) {
        if ((uint)local_40->pid < 0x10) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puStack_48 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puStack_48 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                      ,0xa23,
                                      "(!IsInternalPropertyId(propertyRecord->GetPropertyId()))",
                                      "!IsInternalPropertyId(propertyRecord->GetPropertyId())");
          if (!bVar3) goto LAB_00da2e18;
          *puStack_48 = 0;
        }
        obj = (RecyclableObject *)DynamicObject::GetSlot(this_00,(uint)uVar4);
        if ((obj != (RecyclableObject *)0x0) &&
           ((((bVar3 = DynamicTypeHandler::IsFixedMethodProperty
                                 (&this->super_DynamicTypeHandler,propertyType),
              (ulong)obj >> 0x30 == 0 && (bVar3)) &&
             (bVar3 = VarIsImpl<Js::JavascriptFunction>(obj), bVar3)) ||
            (bVar3 = DynamicTypeHandler::IsFixedDataProperty
                               (&this->super_DynamicTypeHandler,propertyType), bVar3)))) {
          *pProperty = obj;
          *(byte *)&(propertyRecord_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject =
               *(byte *)&(propertyRecord_local->super_FinalizableObject).
                         super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject | 0x40;
          return true;
        }
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0xa32,"(allowNonExistent)",
                                  "Trying to get a fixed function instance for a non-existent property?"
                                 );
      if (!bVar3) {
LAB_00da2e18:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
  }
  return false;
}

Assistant:

bool DictionaryTypeHandlerBase<T>::TryGetFixedProperty(PropertyRecord const * propertyRecord, Var * pProperty, FixedPropertyKind propertyType, ScriptContext * requestContext)
    {
        // Note: This function is not thread-safe and cannot be called from the JIT thread.  That's why we collect and
        // cache any fixed function instances during work item creation on the main thread.
        DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
        if (localSingletonInstance != nullptr && localSingletonInstance->GetScriptContext() == requestContext)
        {
            DictionaryPropertyDescriptor<T>* descriptor;
            if (propertyMap->TryGetReference(propertyRecord, &descriptor))
            {
                if (descriptor->Attributes & PropertyDeleted || !descriptor->GetIsFixed())
                {
                    return false;
                }
                T dataSlot = descriptor->template GetDataPropertyIndex<false>();
                if (dataSlot != NoSlots)
                {
                    Assert(!IsInternalPropertyId(propertyRecord->GetPropertyId()));
                    Var value = localSingletonInstance->GetSlot(dataSlot);
                    if (value && ((IsFixedMethodProperty(propertyType) && VarIs<JavascriptFunction>(value)) || IsFixedDataProperty(propertyType)))
                    {
                        *pProperty = value;
                        if (markAsUsed)
                        {
                            descriptor->SetUsedAsFixed(true);
                        }
                        return true;
                    }
                }
            }
            else
            {
                AssertMsg(allowNonExistent, "Trying to get a fixed function instance for a non-existent property?");
            }
        }

        return false;
    }